

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O1

int mbedtls_ecdsa_write_signature_restartable
              (mbedtls_ecdsa_context *ctx,mbedtls_md_type_t md_alg,uchar *hash,size_t hlen,
              uchar *sig,size_t *slen,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              mbedtls_ecdsa_restart_ctx *rs_ctx)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  size_t __n;
  mbedtls_mpi s;
  mbedtls_mpi r;
  uchar buf [139];
  uchar *in_stack_fffffffffffffef0;
  uchar *__src;
  mbedtls_mpi local_f8;
  mbedtls_mpi local_e0;
  uchar local_c8 [139];
  uchar local_3d [13];
  
  mbedtls_mpi_init(&local_e0);
  mbedtls_mpi_init(&local_f8);
  uVar1 = ecdsa_sign_det_restartable
                    (&ctx->grp,&local_e0,&local_f8,&ctx->d,hash,hlen,md_alg,f_rng,p_rng,
                     in_stack_fffffffffffffef0);
  if (uVar1 == 0) {
    __src = local_3d;
    uVar2 = mbedtls_asn1_write_mpi((uchar **)&stack0xfffffffffffffef0,local_c8,&local_f8);
    uVar1 = uVar2;
    if ((-1 < (int)uVar2) &&
       (uVar1 = mbedtls_asn1_write_mpi((uchar **)&stack0xfffffffffffffef0,local_c8,&local_e0),
       -1 < (int)uVar1)) {
      uVar2 = uVar1 + uVar2;
      uVar3 = mbedtls_asn1_write_len((uchar **)&stack0xfffffffffffffef0,local_c8,(ulong)uVar2);
      uVar1 = uVar3;
      if ((-1 < (int)uVar3) &&
         (uVar1 = mbedtls_asn1_write_tag((uchar **)&stack0xfffffffffffffef0,local_c8,'0'),
         -1 < (int)uVar1)) {
        __n = (ulong)uVar2 + (ulong)uVar1 + (ulong)uVar3;
        memcpy(sig,__src,__n);
        *slen = __n;
        uVar1 = 0;
      }
    }
  }
  mbedtls_mpi_free(&local_e0);
  mbedtls_mpi_free(&local_f8);
  return uVar1;
}

Assistant:

int mbedtls_ecdsa_write_signature_restartable( mbedtls_ecdsa_context *ctx,
                           mbedtls_md_type_t md_alg,
                           const unsigned char *hash, size_t hlen,
                           unsigned char *sig, size_t *slen,
                           int (*f_rng)(void *, unsigned char *, size_t),
                           void *p_rng,
                           mbedtls_ecdsa_restart_ctx *rs_ctx )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi r, s;
    ECDSA_VALIDATE_RET( ctx  != NULL );
    ECDSA_VALIDATE_RET( hash != NULL );
    ECDSA_VALIDATE_RET( sig  != NULL );
    ECDSA_VALIDATE_RET( slen != NULL );

    mbedtls_mpi_init( &r );
    mbedtls_mpi_init( &s );

#if defined(MBEDTLS_ECDSA_DETERMINISTIC)
    MBEDTLS_MPI_CHK( ecdsa_sign_det_restartable( &ctx->grp, &r, &s, &ctx->d,
                                                 hash, hlen, md_alg, f_rng,
                                                 p_rng, rs_ctx ) );
#else
    (void) md_alg;

#if defined(MBEDTLS_ECDSA_SIGN_ALT)
    MBEDTLS_MPI_CHK( mbedtls_ecdsa_sign( &ctx->grp, &r, &s, &ctx->d,
                         hash, hlen, f_rng, p_rng ) );
#else
    /* Use the same RNG for both blinding and ephemeral key generation */
    MBEDTLS_MPI_CHK( ecdsa_sign_restartable( &ctx->grp, &r, &s, &ctx->d,
                                             hash, hlen, f_rng, p_rng, f_rng,
                                             p_rng, rs_ctx ) );
#endif /* MBEDTLS_ECDSA_SIGN_ALT */
#endif /* MBEDTLS_ECDSA_DETERMINISTIC */

    MBEDTLS_MPI_CHK( ecdsa_signature_to_asn1( &r, &s, sig, slen ) );

cleanup:
    mbedtls_mpi_free( &r );
    mbedtls_mpi_free( &s );

    return( ret );
}